

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_app.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  Exception *this;
  ulong uVar2;
  long lVar3;
  Scanner main_scanner;
  Virtual_Machine VM;
  Parser main_parser;
  Scanner local_1e0;
  Virtual_Machine local_190;
  Parser local_118;
  
  if (1 < argc) {
    Scanner::Scanner(&local_1e0,argv[1]);
    Lex::construct_lex_map();
    Scanner::start(&local_1e0);
    if (DEBUG_MODE != 0) {
      Scanner::print_vec(&local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--------TABLES--------",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      if (Scanner::ID_tables_vec.super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          Scanner::ID_tables_vec.super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl
          .super__Vector_impl_data._M_start) {
        lVar3 = 0;
        uVar2 = 0;
        do {
          ID_table_t::print_table
                    ((ID_table_t *)
                     ((long)&((Scanner::ID_tables_vec.
                               super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                               super__Vector_impl_data._M_start)->table).
                             super__Vector_base<ID,_std::allocator<ID>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar3));
          uVar2 = uVar2 + 1;
          uVar1 = ((long)Scanner::ID_tables_vec.
                         super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)Scanner::ID_tables_vec.
                         super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar3 = lVar3 + 0x18;
        } while (uVar2 <= uVar1 && uVar1 - uVar2 != 0);
      }
      if (DEBUG_MODE != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"$$$$$$$$$$ PARSER $$$$$$$$$$$",0x1d);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
      }
    }
    Parser::Parser(&local_118,&local_1e0.lex_vec,&Scanner::ID_tables_vec);
    Parser::start(&local_118);
    if (DEBUG_MODE != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--------TABLES--------",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      if (Scanner::ID_tables_vec.super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          Scanner::ID_tables_vec.super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl
          .super__Vector_impl_data._M_start) {
        lVar3 = 0;
        uVar2 = 0;
        do {
          ID_table_t::print_table
                    ((ID_table_t *)
                     ((long)&((Scanner::ID_tables_vec.
                               super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                               super__Vector_impl_data._M_start)->table).
                             super__Vector_base<ID,_std::allocator<ID>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar3));
          uVar2 = uVar2 + 1;
          uVar1 = ((long)Scanner::ID_tables_vec.
                         super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)Scanner::ID_tables_vec.
                         super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar3 = lVar3 + 0x18;
        } while (uVar2 <= uVar1 && uVar1 - uVar2 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"$$$$$$$$$$ PROG $$$$$$$$$$$",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      RPN::print(&local_118.prog);
      if (DEBUG_MODE != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"$$$$$$$$$$ VIRTUAL MACHINE $$$$$$$$$$$",0x26);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
      }
    }
    Virtual_Machine::Virtual_Machine(&local_190,&local_118.prog,local_118.ID_tables_vec);
    Virtual_Machine::start(&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.tmp_str._M_dataplus._M_p != &local_190.tmp_str.field_2) {
      operator_delete(local_190.tmp_str._M_dataplus._M_p);
    }
    Lex::~Lex(&local_190.arg2);
    Lex::~Lex(&local_190.arg1);
    Lex::~Lex(&local_190.c_lex);
    Lex::~Lex(&local_190.c_cmd);
    std::vector<Lex,_std::allocator<Lex>_>::~vector
              (&local_118.prog.super_vector<Lex,_std::allocator<Lex>_>);
    Lex::~Lex(&local_118.c_lex);
    std::deque<Lex,_std::allocator<Lex>_>::~deque(&local_118.lex_stack.c);
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)&local_118.break_stack);
    Scanner::~Scanner(&local_1e0);
    return 0;
  }
  this = (Exception *)__cxa_allocate_exception(0x30);
  Exception::Exception(this,"Interpreter error: no file",'\0');
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

int main(int argc, char* argv[]){
    try {
        if(argc < 2) throw Exception("Interpreter error: no file");

        int i;

        Scanner main_scanner(argv[1]);
        Lex::construct_lex_map();

        main_scanner.start();
        if (DEBUG_MODE){
            main_scanner.print_vec();
            cout << "--------TABLES--------" << endl;
            for (i = 0; i < main_scanner.ID_tables_vec.size(); ++i) {
                main_scanner.ID_tables_vec[i].print_table();
            }
        }
        if (DEBUG_MODE)
            cout << "$$$$$$$$$$ PARSER $$$$$$$$$$$" << endl;

        Parser main_parser(main_scanner.lex_vec, main_scanner.ID_tables_vec);
        main_parser.start();

        if (DEBUG_MODE) {
            cout << "--------TABLES--------" << endl;
            for (i = 0; i < main_scanner.ID_tables_vec.size(); ++i) {
                main_scanner.ID_tables_vec[i].print_table();
            }
            cout << "$$$$$$$$$$ PROG $$$$$$$$$$$" << endl;
            main_parser.prog.print();
        }

        if (DEBUG_MODE)
            cout << "$$$$$$$$$$ VIRTUAL MACHINE $$$$$$$$$$$" << endl;

        Virtual_Machine VM(main_parser.prog, main_parser.ID_tables_vec);
        VM.start();
    }
    catch (exception& ex){
        cout << ex.what() << endl;
        return -1;
    }
    return 0;
}